

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall
MlmWrap::route_mailbox_msgs
          (MlmWrap *this,char *address,char *sender,char *subject,char *tracker,zmsg_t *msg)

{
  char *__ptr;
  char *format_00;
  string format;
  TrodesMsg m;
  string local_98;
  long *local_78;
  long local_70;
  long local_68 [2];
  TrodesMsg local_58;
  
  format_00 = subject;
  __ptr = zmsg_popstr(msg);
  std::__cxx11::string::string((string *)&local_78,__ptr,(allocator *)&local_58);
  free(__ptr);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  TrodesMsg::TrodesMsg(&local_58,&local_98,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  receiveMailbox(this,sender,subject,format_00,&local_58);
  TrodesMsg::~TrodesMsg(&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return 0;
}

Assistant:

int MlmWrap::route_mailbox_msgs(const char *address, const char *sender, const char *subject, const char *tracker, zmsg_t *msg){
    char *f = zmsg_popstr(msg);
    std::string format = f;
    freen(f);

    TrodesMsg m(format, msg);
    receiveMailbox(sender, subject, format.c_str(), m);
    return 0;
}